

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32.c
# Opt level: O0

uLong cm_zlib_adler32_z(uLong adler,Bytef *buf,z_size_t len)

{
  Bytef *pBVar1;
  Bytef *pBVar2;
  Bytef *pBVar3;
  Bytef *pBVar4;
  Bytef *pBVar5;
  Bytef *pBVar6;
  Bytef *pBVar7;
  Bytef *pBVar8;
  Bytef *pBVar9;
  Bytef *pBVar10;
  Bytef *pBVar11;
  Bytef *pBVar12;
  Bytef *pBVar13;
  Bytef *pBVar14;
  int local_34;
  Bytef *pBStack_30;
  uint n;
  unsigned_long sum2;
  z_size_t len_local;
  Bytef *buf_local;
  uLong adler_local;
  
  pBStack_30 = (Bytef *)(adler >> 0x10 & 0xffff);
  buf_local = (Bytef *)(adler & 0xffff);
  if (len == 1) {
    buf_local = buf_local + *buf;
    if ((Bytef *)0xfff0 < buf_local) {
      buf_local = buf_local + -0xfff1;
    }
    pBStack_30 = buf_local + (long)pBStack_30;
    if ((Bytef *)0xfff0 < pBStack_30) {
      pBStack_30 = pBStack_30 + -0xfff1;
    }
    adler_local = (ulong)buf_local | (long)pBStack_30 << 0x10;
  }
  else if (buf == (Bytef *)0x0) {
    adler_local = 1;
  }
  else {
    sum2 = len;
    len_local = (z_size_t)buf;
    if (len < 0x10) {
      while (sum2 != 0) {
        buf_local = buf_local + *(byte *)len_local;
        pBStack_30 = buf_local + (long)pBStack_30;
        sum2 = sum2 - 1;
        len_local = len_local + 1;
      }
      if ((Bytef *)0xfff0 < buf_local) {
        buf_local = buf_local + -0xfff1;
      }
      adler_local = (ulong)buf_local | (ulong)pBStack_30 % 0xfff1 << 0x10;
    }
    else {
      while (0x15af < sum2) {
        sum2 = sum2 - 0x15b0;
        local_34 = 0x15b;
        do {
          pBVar1 = buf_local + *(byte *)len_local;
          pBVar2 = pBVar1 + *(byte *)(len_local + 1);
          pBVar3 = pBVar2 + *(byte *)(len_local + 2);
          pBVar4 = pBVar3 + *(byte *)(len_local + 3);
          pBVar5 = pBVar4 + *(byte *)(len_local + 4);
          pBVar6 = pBVar5 + *(byte *)(len_local + 5);
          pBVar7 = pBVar6 + *(byte *)(len_local + 6);
          pBVar8 = pBVar7 + *(byte *)(len_local + 7);
          pBVar9 = pBVar8 + *(byte *)(len_local + 8);
          pBVar10 = pBVar9 + *(byte *)(len_local + 9);
          pBVar11 = pBVar10 + *(byte *)(len_local + 10);
          pBVar12 = pBVar11 + *(byte *)(len_local + 0xb);
          pBVar13 = pBVar12 + *(byte *)(len_local + 0xc);
          pBVar14 = pBVar13 + *(byte *)(len_local + 0xd);
          buf_local = pBVar14 + *(byte *)(len_local + 0xe) + *(byte *)(len_local + 0xf);
          pBStack_30 = buf_local +
                       (long)(pBVar14 + *(byte *)(len_local + 0xe) +
                             (long)(pBVar14 +
                                   (long)(pBVar13 +
                                         (long)(pBVar12 +
                                               (long)(pBVar11 +
                                                     (long)(pBVar10 +
                                                           (long)(pBVar9 + (long)(pBVar8 + (long)(
                                                  pBVar7 + (long)(pBVar6 + (long)(pBVar5 + (long)(
                                                  pBVar4 + (long)(pBVar3 + (long)(pBVar2 + (long)(
                                                  pBVar1 + (long)pBStack_30)))))))))))))));
          len_local = len_local + 0x10;
          local_34 = local_34 + -1;
        } while (local_34 != 0);
        buf_local = (Bytef *)((ulong)buf_local % 0xfff1);
        pBStack_30 = (Bytef *)((ulong)pBStack_30 % 0xfff1);
      }
      if (sum2 != 0) {
        for (; 0xf < sum2; sum2 = sum2 - 0x10) {
          pBVar1 = buf_local + *(byte *)len_local;
          pBVar2 = pBVar1 + *(byte *)(len_local + 1);
          pBVar3 = pBVar2 + *(byte *)(len_local + 2);
          pBVar4 = pBVar3 + *(byte *)(len_local + 3);
          pBVar5 = pBVar4 + *(byte *)(len_local + 4);
          pBVar6 = pBVar5 + *(byte *)(len_local + 5);
          pBVar7 = pBVar6 + *(byte *)(len_local + 6);
          pBVar8 = pBVar7 + *(byte *)(len_local + 7);
          pBVar9 = pBVar8 + *(byte *)(len_local + 8);
          pBVar10 = pBVar9 + *(byte *)(len_local + 9);
          pBVar11 = pBVar10 + *(byte *)(len_local + 10);
          pBVar12 = pBVar11 + *(byte *)(len_local + 0xb);
          pBVar13 = pBVar12 + *(byte *)(len_local + 0xc);
          pBVar14 = pBVar13 + *(byte *)(len_local + 0xd);
          buf_local = pBVar14 + *(byte *)(len_local + 0xe) + *(byte *)(len_local + 0xf);
          pBStack_30 = buf_local +
                       (long)(pBVar14 + *(byte *)(len_local + 0xe) +
                             (long)(pBVar14 +
                                   (long)(pBVar13 +
                                         (long)(pBVar12 +
                                               (long)(pBVar11 +
                                                     (long)(pBVar10 +
                                                           (long)(pBVar9 + (long)(pBVar8 + (long)(
                                                  pBVar7 + (long)(pBVar6 + (long)(pBVar5 + (long)(
                                                  pBVar4 + (long)(pBVar3 + (long)(pBVar2 + (long)(
                                                  pBVar1 + (long)pBStack_30)))))))))))))));
          len_local = len_local + 0x10;
        }
        while (sum2 != 0) {
          buf_local = buf_local + *(byte *)len_local;
          pBStack_30 = buf_local + (long)pBStack_30;
          sum2 = sum2 - 1;
          len_local = len_local + 1;
        }
        buf_local = (Bytef *)((ulong)buf_local % 0xfff1);
        pBStack_30 = (Bytef *)((ulong)pBStack_30 % 0xfff1);
      }
      adler_local = (ulong)buf_local | (long)pBStack_30 << 0x10;
    }
  }
  return adler_local;
}

Assistant:

uLong ZEXPORT adler32_z(uLong adler, const Bytef *buf, z_size_t len) {
    unsigned long sum2;
    unsigned n;

    /* split Adler-32 into component sums */
    sum2 = (adler >> 16) & 0xffff;
    adler &= 0xffff;

    /* in case user likes doing a byte at a time, keep it fast */
    if (len == 1) {
        adler += buf[0];
        if (adler >= BASE)
            adler -= BASE;
        sum2 += adler;
        if (sum2 >= BASE)
            sum2 -= BASE;
        return adler | (sum2 << 16);
    }

    /* initial Adler-32 value (deferred check for len == 1 speed) */
    if (buf == Z_NULL)
        return 1L;

    /* in case short lengths are provided, keep it somewhat fast */
    if (len < 16) {
        while (len--) {
            adler += *buf++;
            sum2 += adler;
        }
        if (adler >= BASE)
            adler -= BASE;
        MOD28(sum2);            /* only added so many BASE's */
        return adler | (sum2 << 16);
    }

    /* do length NMAX blocks -- requires just one modulo operation */
    while (len >= NMAX) {
        len -= NMAX;
        n = NMAX / 16;          /* NMAX is divisible by 16 */
        do {
            DO16(buf);          /* 16 sums unrolled */
            buf += 16;
        } while (--n);
        MOD(adler);
        MOD(sum2);
    }

    /* do remaining bytes (less than NMAX, still just one modulo) */
    if (len) {                  /* avoid modulos if none remaining */
        while (len >= 16) {
            len -= 16;
            DO16(buf);
            buf += 16;
        }
        while (len--) {
            adler += *buf++;
            sum2 += adler;
        }
        MOD(adler);
        MOD(sum2);
    }

    /* return recombined sums */
    return adler | (sum2 << 16);
}